

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O0

int ASN1_TYPE_set1(ASN1_TYPE *a,int type,void *value)

{
  ASN1_OBJECT *value_00;
  ASN1_STRING *value_01;
  ASN1_STRING *sdup;
  ASN1_OBJECT *odup;
  void *p;
  void *value_local;
  int type_local;
  ASN1_TYPE *a_local;
  
  if ((value == (void *)0x0) || (type == 1)) {
    ASN1_TYPE_set(a,type,value);
  }
  else if (type == 6) {
    value_00 = OBJ_dup((ASN1_OBJECT *)value);
    if (value_00 == (ASN1_OBJECT *)0x0) {
      return 0;
    }
    ASN1_TYPE_set(a,6,value_00);
  }
  else {
    value_01 = ASN1_STRING_dup((ASN1_STRING *)value);
    if (value_01 == (ASN1_STRING *)0x0) {
      return 0;
    }
    ASN1_TYPE_set(a,type,value_01);
  }
  return 1;
}

Assistant:

int ASN1_TYPE_set1(ASN1_TYPE *a, int type, const void *value) {
  if (!value || (type == V_ASN1_BOOLEAN)) {
    void *p = (void *)value;
    ASN1_TYPE_set(a, type, p);
  } else if (type == V_ASN1_OBJECT) {
    ASN1_OBJECT *odup;
    odup = OBJ_dup(reinterpret_cast<const ASN1_OBJECT *>(value));
    if (!odup) {
      return 0;
    }
    ASN1_TYPE_set(a, type, odup);
  } else {
    ASN1_STRING *sdup;
    sdup = ASN1_STRING_dup(reinterpret_cast<const ASN1_STRING *>(value));
    if (!sdup) {
      return 0;
    }
    ASN1_TYPE_set(a, type, sdup);
  }
  return 1;
}